

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_macro5.c
# Opt level: O2

void specialcat(char *targ,char *src,int trimtarg)

{
  long lVar1;
  char *last;
  char *pcVar2;
  char *pcVar3;
  
  last = (char *)0x0;
  do {
    pcVar3 = targ;
    pcVar2 = last;
    last = pcVar3;
    targ = pcVar3 + 1;
  } while (*pcVar3 != '\0');
  if ((pcVar2 != (char *)0x0 && trimtarg != 0) && (*pcVar2 == '/')) {
    *pcVar2 = '\0';
    pcVar3 = pcVar2;
  }
  for (lVar1 = 0; src[lVar1] != '\0'; lVar1 = lVar1 + 1) {
    pcVar3[lVar1] = src[lVar1];
  }
  pcVar3[lVar1] = '\0';
  return;
}

Assistant:

static void
specialcat(char *targ,char *src,int trimtarg)
{
    char *last = 0;

    while( *targ) {
        last = targ;
        targ++;
    }
    /* TARG now points at terminating NUL */
    /* LAST points at final character in targ. */
    if (trimtarg ) {
        if (last && *last == '/') {
            /* Truncate. */
            *last = 0;
            targ = last;
            /* TARG again points at terminating NUL */
        }
    }
    while (*src) {
        *targ = *src;
        targ++;
        src++;
    }
    *targ = 0;
}